

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBox::insertItems(QComboBox *this,int index,QStringList *list)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QComboBoxPrivate *pQVar5;
  uint *puVar6;
  Promoted<int,_long_long> PVar7;
  QStandardItemModel *pQVar8;
  QStandardItem *this_00;
  const_reference pQVar9;
  ulong uVar10;
  QList<QString> *in_RDX;
  uint in_ESI;
  long in_FS_OFFSET;
  int mc;
  int i_1;
  int i;
  QStandardItem *hiddenRoot;
  QStandardItemModel *m;
  int insertCount;
  QComboBoxPrivate *d;
  QModelIndex item;
  QList<QStandardItem_*> items;
  parameter_type in_stack_fffffffffffffe88;
  QAbstractItemModel *pQVar11;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  int *in_stack_fffffffffffffe98;
  QComboBoxPrivate *pQVar12;
  QModelIndex *in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  QList<QStandardItem_*> *in_stack_fffffffffffffeb8;
  int local_120;
  int local_11c;
  undefined4 in_stack_fffffffffffffef8;
  QPersistentModelIndex local_e8 [3];
  QPersistentModelIndex local_d0 [3];
  QPersistentModelIndex local_b8 [3];
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  QPersistentModelIndex local_70 [3];
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  qsizetype local_40;
  int local_38;
  int local_34;
  undefined4 local_30;
  uint local_2c;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = in_ESI;
  pQVar5 = d_func((QComboBox *)0x539b15);
  bVar2 = QList<QString>::isEmpty((QList<QString> *)0x539b27);
  if (!bVar2) {
    local_30 = 0;
    local_34 = count((QComboBox *)in_stack_fffffffffffffea0);
    puVar6 = (uint *)qBound<int>(&in_stack_fffffffffffffea0->r,in_stack_fffffffffffffe98,
                                 (int *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90
                                                ));
    local_2c = *puVar6;
    local_38 = pQVar5->maxCount - local_2c;
    local_40 = QList<QString>::size(in_RDX);
    PVar7 = qMin<int,long_long>(&local_38,&local_40);
    iVar4 = (int)PVar7;
    if (0 < iVar4) {
      pQVar8 = qobject_cast<QStandardItemModel*>((QObject *)0x539bd8);
      uVar1 = local_2c;
      if (pQVar8 == (QStandardItemModel *)0x0) {
        pQVar5->field_0x34c = pQVar5->field_0x34c & 0xf7 | 8;
        pQVar11 = pQVar5->model;
        iVar3 = iVar4;
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_70);
        uVar10 = (**(code **)(*(long *)pQVar11 + 0xf8))(pQVar11,uVar1,iVar4,local_70);
        if ((uVar10 & 1) == 0) {
          pQVar5->field_0x34c = pQVar5->field_0x34c & 0xf7;
        }
        else {
          local_88 = &DAT_aaaaaaaaaaaaaaaa;
          local_80 = &DAT_aaaaaaaaaaaaaaaa;
          local_78 = &DAT_aaaaaaaaaaaaaaaa;
          QModelIndex::QModelIndex((QModelIndex *)0x539d83);
          for (local_120 = 0; local_120 < iVar3; local_120 = local_120 + 1) {
            in_stack_fffffffffffffea0 = (QModelIndex *)pQVar5->model;
            in_stack_fffffffffffffea8 = local_120 + local_2c;
            in_stack_fffffffffffffeac = pQVar5->modelColumn;
            QPersistentModelIndex::operator_cast_to_QModelIndex(local_b8);
            (**(code **)(*(long *)in_stack_fffffffffffffea0 + 0x60))
                      (&local_a0,in_stack_fffffffffffffea0,in_stack_fffffffffffffea8,
                       in_stack_fffffffffffffeac,local_b8);
            local_88 = local_a0;
            local_80 = local_98;
            local_78 = local_90;
            pQVar11 = pQVar5->model;
            pQVar9 = QList<QString>::at((QList<QString> *)
                                        CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90
                                                ),(qsizetype)in_stack_fffffffffffffe88);
            ::QVariant::QVariant(&local_28,(QString *)pQVar9);
            (**(code **)(*(long *)pQVar11 + 0x98))(pQVar11,&local_88,&local_28,2);
            ::QVariant::~QVariant(&local_28);
          }
          pQVar5->field_0x34c = pQVar5->field_0x34c & 0xf7;
          pQVar12 = pQVar5;
          QPersistentModelIndex::operator_cast_to_QModelIndex(local_d0);
          QComboBoxPrivate::rowsInserted
                    ((QComboBoxPrivate *)
                     CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                     in_stack_fffffffffffffea0,(int)((ulong)pQVar12 >> 0x20),(int)pQVar12);
        }
      }
      else {
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        local_50 = &DAT_aaaaaaaaaaaaaaaa;
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        QList<QStandardItem_*>::QList((QList<QStandardItem_*> *)0x539c23);
        QList<QStandardItem_*>::reserve
                  (in_stack_fffffffffffffeb8,CONCAT44(iVar4,in_stack_fffffffffffffef8));
        iVar3 = QStandardItemModel::invisibleRootItem();
        for (local_11c = 0; local_11c < iVar4; local_11c = local_11c + 1) {
          this_00 = (QStandardItem *)operator_new(0x10);
          pQVar9 = QList<QString>::at((QList<QString> *)
                                      CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                      (qsizetype)in_stack_fffffffffffffe88);
          QStandardItem::QStandardItem(this_00,(QString *)pQVar9);
          QList<QStandardItem_*>::append
                    ((QList<QStandardItem_*> *)0x539c96,in_stack_fffffffffffffe88);
        }
        QStandardItem::insertRows(iVar3,(QList_conflict2 *)(ulong)local_2c);
        QList<QStandardItem_*>::~QList((QList<QStandardItem_*> *)0x539cc9);
      }
      iVar4 = count((QComboBox *)in_stack_fffffffffffffea0);
      if (pQVar5->maxCount < iVar4) {
        pQVar11 = pQVar5->model;
        iVar3 = pQVar5->maxCount;
        iVar4 = iVar4 - pQVar5->maxCount;
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_e8);
        (**(code **)(*(long *)pQVar11 + 0x108))(pQVar11,iVar3,iVar4,local_e8);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBox::insertItems(int index, const QStringList &list)
{
    Q_D(QComboBox);
    if (list.isEmpty())
        return;
    index = qBound(0, index, count());
    int insertCount = qMin(d->maxCount - index, list.size());
    if (insertCount <= 0)
        return;
    // For the common case where we are using the built in QStandardItemModel
    // construct a QStandardItem, reducing the number of expensive signals from the model
    if (QStandardItemModel *m = qobject_cast<QStandardItemModel*>(d->model)) {
        QList<QStandardItem *> items;
        items.reserve(insertCount);
        QStandardItem *hiddenRoot = m->invisibleRootItem();
        for (int i = 0; i < insertCount; ++i)
            items.append(new QStandardItem(list.at(i)));
        hiddenRoot->insertRows(index, items);
    } else {
        d->inserting = true;
        if (d->model->insertRows(index, insertCount, d->root)) {
            QModelIndex item;
            for (int i = 0; i < insertCount; ++i) {
                item = d->model->index(i+index, d->modelColumn, d->root);
                d->model->setData(item, list.at(i), Qt::EditRole);
            }
            d->inserting = false;
            d->rowsInserted(d->root, index, index + insertCount - 1);
        } else {
            d->inserting = false;
        }
    }

    int mc = count();
    if (mc > d->maxCount)
        d->model->removeRows(d->maxCount, mc - d->maxCount, d->root);
}